

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_teebuf.hpp
# Opt level: O0

int_type __thiscall
OpenMD::basic_teebuf<char,_std::char_traits<char>_>::overflow
          (basic_teebuf<char,_std::char_traits<char>_> *this,int_type c)

{
  bool bVar1;
  int_type iVar2;
  reference ppbVar3;
  int in_ESI;
  __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
  *in_RDI;
  iterator iter;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
  local_20 [3];
  int_type local_4;
  
  iVar2 = std::char_traits<char>::eof();
  if (in_ESI == iVar2) {
    local_4 = std::char_traits<char>::eof();
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
    ::__normal_iterator(local_20);
    local_20[0]._M_current =
         (basic_streambuf<char,_std::char_traits<char>_> **)
         std::
         vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
         ::begin((vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
                  *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    while( true ) {
      std::
      vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
      ::end((vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
             *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (!bVar1) break;
      ppbVar3 = __gnu_cxx::
                __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
                ::operator*(local_20);
      in_stack_ffffffffffffffbc = std::streambuf::sputc((char)*ppbVar3);
      iVar2 = std::char_traits<char>::eof();
      if (in_stack_ffffffffffffffbc == iVar2) {
        iVar2 = std::char_traits<char>::eof();
        return iVar2;
      }
      __gnu_cxx::
      __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(local_20);
    }
    local_4 = std::char_traits<char>::not_eof((int_type *)in_RDI);
  }
  return local_4;
}

Assistant:

int_type overflow(int_type c = traits_type::eof()) {
      // avoid writing eof to stream
      if (c == traits_type::eof()) { return traits_type::eof(); }

      typename std::vector<streambuf_type*>::iterator
          iter;  // typename is needed since it's a dependant name
      for (iter = buffers_.begin(); iter != buffers_.end(); ++iter) {
        if ((*iter)->sputc(c) == traits_type::eof()) {
          return traits_type::eof();
        }
      }

      return traits_type::not_eof(c);
    }